

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O2

ssize_t write(int __fd,void *__buf,size_t __n)

{
  rpchook_t *prVar1;
  long lVar2;
  __time_t _Var3;
  bool bVar4;
  ulong uVar5;
  int *piVar6;
  ssize_t sVar7;
  ulong uVar8;
  pollfd local_38;
  
  if (g_sys_write_func == (write_pfn_t)0x0) {
    g_sys_write_func = (write_pfn_t)dlsym(0xffffffffffffffff,"write");
  }
  bVar4 = co_is_enable_sys_hook();
  if ((((!bVar4) || (999999 < (uint)__fd)) ||
      (prVar1 = g_rpchook_socket_fd[(uint)__fd], prVar1 == (rpchook_t *)0x0)) ||
     ((prVar1->user_flag & 0x800) != 0)) {
    sVar7 = (*g_sys_write_func)(__fd,__buf,__n);
    return sVar7;
  }
  _Var3 = (prVar1->write_timeout).tv_sec;
  lVar2 = (prVar1->write_timeout).tv_usec;
  uVar5 = (*g_sys_write_func)(__fd,__buf,__n);
  if ((long)uVar5 < 0) {
    piVar6 = __errno_location();
    if (*piVar6 != 0xb) {
      return uVar5;
    }
    uVar5 = 0;
  }
  uVar8 = uVar5;
  do {
    if (__n < uVar8 || __n - uVar8 == 0) {
LAB_001059d8:
      if (0 < (long)uVar5) {
        uVar5 = uVar8;
      }
      if (uVar8 == 0) {
        uVar8 = uVar5;
      }
      return uVar8;
    }
    local_38.events = 0x1c;
    local_38.revents = 0;
    local_38.fd = __fd;
    poll(&local_38,1,(int)(lVar2 / 1000) + (int)_Var3 * 1000);
    uVar5 = (*g_sys_write_func)(__fd,(void *)((long)__buf + uVar8),__n - uVar8);
    if ((long)uVar5 < 0) {
      piVar6 = __errno_location();
      if (*piVar6 == 0xb) {
        *piVar6 = 0x7c5;
      }
      goto LAB_001059d8;
    }
    uVar8 = uVar8 + uVar5;
  } while( true );
}

Assistant:

ssize_t write( int fd, const void *buf, size_t nbyte ) //special write which would return only on successfully writing entire data
{
	HOOK_SYS_FUNC( write );
	
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_write_func( fd,buf,nbyte );
	}
	rpchook_t *lp = get_by_fd( fd );

	if( !lp || ( O_NONBLOCK & lp->user_flag ) )
	{
		ssize_t ret = g_sys_write_func( fd,buf,nbyte );
		return ret;
	}
	size_t wrotelen = 0;
	int timeout = ( lp->write_timeout.tv_sec * 1000 ) 
				+ ( lp->write_timeout.tv_usec / 1000 );

	ssize_t writeret = g_sys_write_func( fd,(const char*)buf + wrotelen,nbyte - wrotelen );
	if(writeret <0 && (errno == EAGAIN || errno == EWOULDBLOCK )){
		//retry with libco poll
		writeret = 0;
	}

	if(writeret<0){
		return writeret;
	}
	wrotelen+=writeret;

	while( wrotelen < nbyte ){//write data to socket as much as possible

		struct pollfd pf = { 0 };
		pf.fd = fd;
		pf.events = ( POLLOUT | POLLERR | POLLHUP );
		poll( &pf,1,timeout );
		//is writeable or poll timedout here
		writeret = g_sys_write_func( fd,(const char*)buf + wrotelen,nbyte - wrotelen );
		if( writeret < 0 ){
			//timeout from co_routine_poll, errno set to indicate special value
			if( errno == EAGAIN  || errno == EWOULDBLOCK ){
				//poll timed out , the socket is still unwritable
				errno = LIBCO_POLL_TIMEOUT;
			}
			break;
		}
		wrotelen += writeret ;
	}
	if (writeret <= 0 && wrotelen == 0){
		return writeret;
	}
	return wrotelen;
}